

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  FunctionBody *functionBody;
  undefined4 *puVar4;
  
  if (funcInfo == (FuncInfo *)0x0) {
    functionBody = (FunctionBody *)0x0;
  }
  else {
    functionBody = FuncInfo::GetParsedFunctionBody(funcInfo);
  }
  if (functionBody == (FunctionBody *)0x0) {
    bVar3 = Js::Phases::IsEnabledForAll((Phases *)&DAT_015bbe90,NativeArrayPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,NativeArrayPhase,sourceContextId,
                       ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                       .ptr)->functionId);
  }
  if ((bVar3 == false) &&
     (((pUVar1 = byteCodeGenerator->m_utf8SourceInfo, (pUVar1->debugModeSource).ptr == (uchar *)0x0
       && ((pUVar1->field_0xa8 & 0x20) == 0)) || ((pUVar1->field_0xa8 & 0x40) == 0)))) {
    if (functionBody != (FunctionBody *)0x0) {
      bVar3 = Js::DynamicProfileInfo::IsEnabled(NativeArrayPhase,functionBody);
      return bVar3;
    }
    bVar3 = Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction
                      (NativeArrayPhase,byteCodeGenerator->scriptContext);
    return bVar3;
  }
  return false;
}

Assistant:

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
#if ENABLE_PROFILE_INFO
    Js::FunctionBody *functionBody = funcInfo ? funcInfo->GetParsedFunctionBody() : nullptr;

    return
        !PHASE_OFF_OPTFUNC(Js::NativeArrayPhase, functionBody) &&
        !byteCodeGenerator->IsInDebugMode() &&
        (
            functionBody
                ? Js::DynamicProfileInfo::IsEnabled(Js::NativeArrayPhase, functionBody)
                : Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction(
                    Js::NativeArrayPhase,
                    byteCodeGenerator->GetScriptContext())
        );
#else
    return false;
#endif
}